

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

void secp256k1_ellswift_prng(uchar *out32,secp256k1_sha256 *hasher,uint32_t cnt)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  ulong len;
  undefined4 in_EDX;
  void *in_RSI;
  size_t blocks;
  uchar buf4 [4];
  secp256k1_sha256 hash;
  undefined4 in_stack_ffffffffffffff78;
  secp256k1_sha256 *in_stack_ffffffffffffff80;
  ulong local_20;
  
  memcpy(&stack0xffffffffffffff80,in_RSI,0x68);
  len = local_20 >> 6;
  uVar1 = (undefined1)in_EDX;
  uVar2 = (undefined1)((uint)in_EDX >> 8);
  uVar3 = (undefined1)((uint)in_EDX >> 0x10);
  uVar4 = (undefined1)((uint)in_EDX >> 0x18);
  secp256k1_sha256_write
            (in_stack_ffffffffffffff80,
             (uchar *)CONCAT17(uVar4,CONCAT16(uVar3,CONCAT15(uVar2,CONCAT14(uVar1,
                                                  in_stack_ffffffffffffff78)))),len);
  secp256k1_sha256_finalize
            (in_stack_ffffffffffffff80,
             (uchar *)CONCAT17(uVar4,CONCAT16(uVar3,CONCAT15(uVar2,CONCAT14(uVar1,
                                                  in_stack_ffffffffffffff78)))));
  if (local_20 >> 6 != len + 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modules/ellswift/main_impl.h"
            ,0x144,"test condition failed: ((hash.bytes) >> 6) == (blocks + 1)");
    abort();
  }
  return;
}

Assistant:

static void secp256k1_ellswift_prng(unsigned char* out32, const secp256k1_sha256 *hasher, uint32_t cnt) {
    secp256k1_sha256 hash = *hasher;
    unsigned char buf4[4];
#ifdef VERIFY
    size_t blocks = hash.bytes >> 6;
#endif
    buf4[0] = cnt;
    buf4[1] = cnt >> 8;
    buf4[2] = cnt >> 16;
    buf4[3] = cnt >> 24;
    secp256k1_sha256_write(&hash, buf4, 4);
    secp256k1_sha256_finalize(&hash, out32);

    /* Writing and finalizing together should trigger exactly one SHA256 compression. */
    VERIFY_CHECK(((hash.bytes) >> 6) == (blocks + 1));
}